

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O2

int __thiscall
YAML::RegEx::MatchUnchecked<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  int iVar1;
  
  switch(this->m_op) {
  case REGEX_EMPTY:
    iVar1 = MatchOpEmpty<YAML::StreamCharSource>(this,source);
    return iVar1;
  case REGEX_MATCH:
    iVar1 = MatchOpMatch<YAML::StreamCharSource>(this,source);
    return iVar1;
  case REGEX_RANGE:
    iVar1 = MatchOpRange<YAML::StreamCharSource>(this,source);
    return iVar1;
  case REGEX_OR:
    iVar1 = MatchOpOr<YAML::StreamCharSource>(this,source);
    return iVar1;
  case REGEX_AND:
    iVar1 = MatchOpAnd<YAML::StreamCharSource>(this,source);
    return iVar1;
  case REGEX_NOT:
    iVar1 = MatchOpNot<YAML::StreamCharSource>(this,source);
    return iVar1;
  case REGEX_SEQ:
    iVar1 = MatchOpSeq<YAML::StreamCharSource>(this,source);
    return iVar1;
  default:
    return -1;
  }
}

Assistant:

inline int RegEx::MatchUnchecked(const Source& source) const {
  switch (m_op) {
    case REGEX_EMPTY:
      return MatchOpEmpty(source);
    case REGEX_MATCH:
      return MatchOpMatch(source);
    case REGEX_RANGE:
      return MatchOpRange(source);
    case REGEX_OR:
      return MatchOpOr(source);
    case REGEX_AND:
      return MatchOpAnd(source);
    case REGEX_NOT:
      return MatchOpNot(source);
    case REGEX_SEQ:
      return MatchOpSeq(source);
  }

  return -1;
}